

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleListDecoder.h
# Opt level: O0

O3DGCErrorCode __thiscall
o3dgc::TriangleListDecoder<unsigned_short>::Decode
          (TriangleListDecoder<unsigned_short> *this,unsigned_short *triangles,long numTriangles,
          long numVertices,BinaryStream *bstream,unsigned_long *iterator)

{
  byte bVar1;
  unsigned_long maxSizeV2T_00;
  unsigned_long maxSizeV2T;
  uchar compressionMask;
  unsigned_long *iterator_local;
  BinaryStream *bstream_local;
  long numVertices_local;
  long numTriangles_local;
  unsigned_short *triangles_local;
  TriangleListDecoder<unsigned_short> *this_local;
  
  bVar1 = BinaryStream::ReadUChar(bstream,iterator,this->m_streamType);
  this->m_decodeTrianglesOrder = (bVar1 & 2) != 0;
  this->m_decodeVerticesOrder = (bVar1 & 1) != 0;
  if ((this->m_decodeVerticesOrder & 1U) == 0) {
    maxSizeV2T_00 = BinaryStream::ReadUInt32(bstream,iterator,this->m_streamType);
    Init(this,triangles,numTriangles,numVertices,maxSizeV2T_00);
    CompressedTriangleFans::Load
              (&this->m_ctfans,bstream,iterator,(bool)(this->m_decodeTrianglesOrder & 1),
               this->m_streamType);
    Decompress(this);
    this_local._4_4_ = O3DGC_OK;
  }
  else {
    this_local._4_4_ = O3DGC_ERROR_NON_SUPPORTED_FEATURE;
  }
  return this_local._4_4_;
}

Assistant:

O3DGCErrorCode              Decode(T * const triangles,
                                           const long numTriangles,
                                           const long numVertices,
                                           const BinaryStream & bstream,
                                           unsigned long & iterator)
                                    {
                                        unsigned char compressionMask = bstream.ReadUChar(iterator, m_streamType); 
                                        m_decodeTrianglesOrder = ( (compressionMask&2) != 0);
                                        m_decodeVerticesOrder = ( (compressionMask&1) != 0); 
                                        if (m_decodeVerticesOrder)  // vertices reordering not supported
                                        {
                                            return O3DGC_ERROR_NON_SUPPORTED_FEATURE;
                                        }
                                        unsigned long maxSizeV2T = bstream.ReadUInt32(iterator, m_streamType);
                                        Init(triangles, numTriangles, numVertices, maxSizeV2T);
                                        m_ctfans.Load(bstream, iterator, m_decodeTrianglesOrder, m_streamType);
                                        Decompress();
                                        return O3DGC_OK;
                                    }